

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Targa.cpp
# Opt level: O0

void __thiscall TargaImage::put_pixel(TargaImage *this,rgb color)

{
  int iVar1;
  TargaImage *this_local;
  rgb color_local;
  
  this->buffer[this->pos].r = color.b;
  this_local._6_1_ = color.g;
  this->buffer[this->pos].g = this_local._6_1_;
  this_local._5_1_ = color.r;
  this->buffer[this->pos].b = this_local._5_1_;
  iVar1 = this->pos + 1;
  this->pos = iVar1;
  if (this->buf_size <= iVar1) {
    flush(this);
  }
  return;
}

Assistant:

void TargaImage::put_pixel( rgb color )
{
    buffer[pos].r =   color.b; // swap red & blue   colors
    buffer[pos].g =   color.g;
    buffer[pos].b =   color.r;

    if( ++pos >= buf_size ) flush();
}